

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<int,unsigned_int,unsigned_int,long,long,long>
                   (char *fmt,int *args,uint *args_1,uint *args_2,long *args_3,long *args_4,
                   long *args_5)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  long *in_stack_fffffffffffffe20;
  string *args_1_00;
  ostringstream *this;
  char *in_stack_fffffffffffffe40;
  ostream *in_stack_fffffffffffffe48;
  ostringstream local_180 [128];
  long *in_stack_ffffffffffffff00;
  long *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  args_1_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  format<int,unsigned_int,unsigned_int,long,long,long>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(int *)this,(uint *)args_1_00,
             (uint *)in_RDI,in_stack_fffffffffffffe20,in_stack_ffffffffffffff00,
             in_stack_ffffffffffffff08);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return args_1_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}